

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

int Bac_CommandRead(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Io_FileType_t FileType;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  char *pcVar7;
  Vec_Ptr_t *vDes_1;
  Abc_Ntk_t *pAbcNtk;
  int fVerbose;
  int fUsePtr;
  int fUseAbc;
  int c;
  char *pFileName;
  Vec_Ptr_t *vDes;
  Bac_Man_t *p;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  vDes = (Vec_Ptr_t *)0x0;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  Extra_UtilGetoptReset();
LAB_0045eae7:
  iVar4 = Extra_UtilGetopt(argc,argv,"apvh");
  if (iVar4 == -1) {
    if (argc == globalUtilOptind + 1) {
      pcVar7 = argv[globalUtilOptind];
      __stream = fopen(pcVar7,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(1,"Cannot open input file \"%s\". ",pcVar7);
        pcVar7 = Extra_FileGetSimilarName(pcVar7,".v",".blif",".smt",".bac",(char *)0x0);
        if (pcVar7 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar7);
        }
        Abc_Print(1,"\n");
      }
      else {
        fclose(__stream);
        if ((bVar1) || (bVar2)) {
          FileType = Io_ReadFileType(pcVar7);
          pNtk = Io_ReadNetlist(pcVar7,FileType,0);
          pVVar5 = Ptr_AbcDeriveDes(pNtk);
          vDes = (Vec_Ptr_t *)Bac_PtrTransformToCba(pVVar5);
          Bac_PtrFree(pVVar5);
          if ((Bac_Man_t *)vDes != (Bac_Man_t *)0x0) {
            if (((Bac_Man_t *)vDes)->pSpec != (char *)0x0) {
              free(((Bac_Man_t *)vDes)->pSpec);
              ((Bac_Man_t *)vDes)->pSpec = (char *)0x0;
            }
            pcVar7 = Abc_UtilStrsav(pNtk->pSpec);
            ((Bac_Man_t *)vDes)->pSpec = pcVar7;
          }
          Abc_NtkDelete(pNtk);
        }
        else {
          pcVar6 = Extra_FileNameExtension(pcVar7);
          iVar4 = strcmp(pcVar6,"blif");
          if (iVar4 == 0) {
            pVVar5 = Psr_ManReadBlif(pcVar7);
            if ((pVVar5 != (Vec_Ptr_t *)0x0) && (iVar4 = Vec_PtrSize(pVVar5), iVar4 != 0)) {
              vDes = (Vec_Ptr_t *)Psr_ManBuildCba(pcVar7,pVVar5);
            }
            if (pVVar5 != (Vec_Ptr_t *)0x0) {
              Psr_ManVecFree(pVVar5);
            }
          }
          else {
            pcVar6 = Extra_FileNameExtension(pcVar7);
            iVar4 = strcmp(pcVar6,"v");
            if (iVar4 == 0) {
              pVVar5 = Psr_ManReadVerilog(pcVar7);
              if ((pVVar5 != (Vec_Ptr_t *)0x0) && (iVar4 = Vec_PtrSize(pVVar5), iVar4 != 0)) {
                vDes = (Vec_Ptr_t *)Psr_ManBuildCba(pcVar7,pVVar5);
              }
              if (pVVar5 != (Vec_Ptr_t *)0x0) {
                Psr_ManVecFree(pVVar5);
              }
            }
            else {
              pcVar6 = Extra_FileNameExtension(pcVar7);
              iVar4 = strcmp(pcVar6,"smt");
              if (iVar4 == 0) {
                vDes = (Vec_Ptr_t *)0x0;
              }
              else {
                pcVar6 = Extra_FileNameExtension(pcVar7);
                iVar4 = strcmp(pcVar6,"bac");
                if (iVar4 != 0) {
                  printf("Unrecognized input file extension.\n");
                  return 0;
                }
                vDes = (Vec_Ptr_t *)Bac_ManReadBac(pcVar7);
              }
            }
          }
        }
        Bac_AbcUpdateMan(pAbc,(Bac_Man_t *)vDes);
      }
    }
    else {
      printf("Bac_CommandRead(): Input file name should be given on the command line.\n");
    }
    return 0;
  }
  switch(iVar4) {
  case 0x61:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0045eae7;
  default:
    break;
  case 0x68:
    break;
  case 0x70:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0045eae7;
  case 0x76:
    goto switchD_0045eb25_caseD_76;
  }
  Abc_Print(-2,"usage: @_read [-apvh] <file_name>\n");
  Abc_Print(-2,"\t         reads hierarchical design in BLIF or Verilog\n");
  pcVar7 = "no";
  if (bVar1) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle using old ABC parser [default = %s]\n",pcVar7);
  pcVar7 = "no";
  if (bVar2) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-p     : toggle using Ptr construction [default = %s]\n",pcVar7);
  pcVar7 = "no";
  if (bVar3) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_0045eb25_caseD_76:
  bVar3 = (bool)(bVar3 ^ 1);
  goto LAB_0045eae7;
}

Assistant:

int Bac_CommandRead( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Bac_Man_t * p = NULL;
    Vec_Ptr_t * vDes = NULL;
    char * pFileName = NULL;
    int c, fUseAbc = 0, fUsePtr = 0, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "apvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAbc ^= 1;
            break;
        case 'p':
            fUsePtr ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Bac_CommandRead(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".blif", ".smt", ".bac", NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );
    // perform reading
    if ( fUseAbc || fUsePtr )
    {
        extern Vec_Ptr_t * Ptr_AbcDeriveDes( Abc_Ntk_t * pNtk );
        Abc_Ntk_t * pAbcNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 0 );
        Vec_Ptr_t * vDes = Ptr_AbcDeriveDes( pAbcNtk );
        p = Bac_PtrTransformToCba( vDes );
        Bac_PtrFree( vDes ); // points to names in pAbcNtk
        if ( p )
        {
            ABC_FREE( p->pSpec );
            p->pSpec = Abc_UtilStrsav( pAbcNtk->pSpec );
        }
        Abc_NtkDelete( pAbcNtk );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
    {
        vDes = Psr_ManReadBlif( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
    {
        vDes = Psr_ManReadVerilog( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "smt" )  )
    {
        vDes = NULL;//Psr_ManReadSmt( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "bac" )  )
    {
        p = Bac_ManReadBac( pFileName );
    }
    else 
    {
        printf( "Unrecognized input file extension.\n" );
        return 0;
    }
    Bac_AbcUpdateMan( pAbc, p );
    return 0;
usage:
    Abc_Print( -2, "usage: @_read [-apvh] <file_name>\n" );
    Abc_Print( -2, "\t         reads hierarchical design in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-a     : toggle using old ABC parser [default = %s]\n", fUseAbc? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle using Ptr construction [default = %s]\n", fUsePtr? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}